

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

char * mraa_get_pin_name(int pin)

{
  mraa_board_t *pmVar1;
  mraa_pininfo_t *pmVar2;
  
  if (plat == (mraa_board_t *)0x0) {
    pmVar2 = (mraa_pininfo_t *)0x0;
  }
  else {
    pmVar1 = plat;
    if (((uint)pin >> 9 & 1) != 0) {
      pmVar1 = plat->sub_platform;
      if (pmVar1 == (mraa_board_t *)0x0) {
        syslog(3,"mraa_get_pin_name: Sub platform Not Initialised");
        return (char *)0x0;
      }
      pin = pin & 0xfffffdff;
    }
    pmVar2 = (mraa_pininfo_t *)0x0;
    if ((-1 < pin) && (pin < pmVar1->phy_pin_count)) {
      pmVar2 = pmVar1->pins + (uint)pin;
    }
  }
  return pmVar2->name;
}

Assistant:

char*
mraa_get_pin_name(int pin)
{
    if (plat == NULL) {
        return 0;
    }

    mraa_board_t* current_plat = plat;
    if (mraa_is_sub_platform_id(pin)) {
        current_plat = plat->sub_platform;
        if (current_plat == NULL) {
            syslog(LOG_ERR, "mraa_get_pin_name: Sub platform Not Initialised");
            return 0;
        }
        pin = mraa_get_sub_platform_index(pin);
    }

    if (pin > (current_plat->phy_pin_count - 1) || pin < 0) {
        return NULL;
    }
    return (char*) current_plat->pins[pin].name;
}